

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MapFieldBase::DeleteMapValue(MapFieldBase *this,MapKey *map_key)

{
  bool k;
  CppType CVar1;
  ViewType_conflict k_00;
  size_type sVar2;
  ViewType_conflict1 k_01;
  KeyMapBase<bool> *this_00;
  string_view k_02;
  
  if (((this->super_MapFieldBaseForParse).payload_._M_i & 1) != 0) {
    (*MapFieldBaseForParse::sync_map_with_repeated)(this,1);
  }
  CVar1 = MapKey::type(map_key);
  if (8 < CVar1 - CPPTYPE_INT32) {
switchD_00244c0c_caseD_5:
    DeleteMapValue();
  }
  this_00 = (KeyMapBase<bool> *)(this + 1);
  switch(CVar1) {
  case CPPTYPE_INT32:
    k_00 = MapKey::GetInt32Value(map_key);
    break;
  case CPPTYPE_INT64:
    k_01 = MapKey::GetInt64Value(map_key);
    goto LAB_00244c68;
  case CPPTYPE_UINT32:
    k_00 = MapKey::GetUInt32Value(map_key);
    break;
  case CPPTYPE_UINT64:
    k_01 = MapKey::GetUInt64Value(map_key);
LAB_00244c68:
    sVar2 = KeyMapBase<unsigned_long>::EraseImpl((KeyMapBase<unsigned_long> *)this_00,k_01);
    goto LAB_00244c73;
  default:
    goto switchD_00244c0c_caseD_5;
  case CPPTYPE_BOOL:
    k = MapKey::GetBoolValue(map_key);
    sVar2 = KeyMapBase<bool>::EraseImpl(this_00,k);
    goto LAB_00244c73;
  case CPPTYPE_STRING:
    k_02 = MapKey::GetStringValue(map_key);
    sVar2 = KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::EraseImpl((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00,k_02);
    goto LAB_00244c73;
  }
  sVar2 = KeyMapBase<unsigned_int>::EraseImpl((KeyMapBase<unsigned_int> *)this_00,k_00);
LAB_00244c73:
  return sVar2 != 0;
}

Assistant:

bool MapFieldBase::DeleteMapValue(const MapKey& map_key) {
  return VisitMapKey(map_key, *MutableMap(), [](auto& map, const auto& key) {
    return map.EraseImpl(key);
  });
}